

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpDef.cpp
# Opt level: O2

bool __thiscall Liby::http::ReplyParser::ParseHttpVersion(ReplyParser *this,char *begin,char *end)

{
  int iVar1;
  
  if (((end != (char *)0x0) && (begin != (char *)0x0)) && (begin <= end)) {
    if (((int)end - (int)begin == 8) && (iVar1 = strncmp("HTTP/1.1",begin,8), iVar1 == 0)) {
      this->progress_ = 2;
      return true;
    }
    this->progress_ = 7;
    return false;
  }
  __assert_fail("begin <= end && begin && end",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpDef.cpp"
                ,0x19b,"bool Liby::http::ReplyParser::ParseHttpVersion(const char *, const char *)")
  ;
}

Assistant:

bool ReplyParser::ParseHttpVersion(const char *begin, const char *end) {
    assert(begin <= end && begin && end);

    int length = end - begin;
    if (length != 8) {
        progress_ = InvalidVersion;
        return false;
    }
    if (!std::strncmp("HTTP/1.1", begin, 8)) {
        progress_ = ParsingStatus;
        return true;
    } else {
        progress_ = InvalidVersion;
        return false;
    }
}